

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1d_cbs.c
# Opt level: O1

MPP_RET mpp_av1_read_unit(AV1Context *ctx,Av1ObuUnit *unit)

{
  byte bVar1;
  int iVar2;
  int iVar3;
  AV1RawSequenceHeader *pAVar4;
  RK_S32 RVar5;
  RK_S32 RVar6;
  MPP_RET MVar7;
  uint uVar8;
  MPP_RET MVar9;
  AV1RawOBUHeader *current;
  AV1RawOBUHeader AVar10;
  RK_U32 hdr_fmt;
  uint uVar11;
  RK_S32 extraout_EDX;
  RK_S32 extraout_EDX_00;
  AV1RawDecoderModelInfo *current_00;
  AV1RawOBUHeader AVar12;
  AV1RawOBUHeader AVar13;
  ulong uVar14;
  BitReadCtx_t *bitctx;
  char *in_R8;
  int iVar15;
  long lVar16;
  AV1RawOBUHeader AVar17;
  ulong uVar18;
  RK_U8 *pRVar19;
  bool bVar20;
  RK_U64 obu_size;
  BitReadCtx_t gbc;
  ulong in_stack_ffffffffffffff38;
  undefined4 uVar21;
  AV1RawOBUHeader local_b0;
  ulong local_a8;
  MPP_RET local_9c;
  RK_U8 *local_98;
  MPP_RET local_54;
  int local_40;
  undefined4 uStack_3c;
  AV1RawSequenceHeader *local_38;
  
  if (unit->content != (void *)0x0) {
    mpp_osal_free("mpp_av1_alloc_unit_content",unit->content);
  }
  unit->content = (void *)0x0;
  current = (AV1RawOBUHeader *)mpp_osal_calloc("mpp_av1_alloc_unit_content",0xb20);
  unit->content = current;
  if (current == (AV1RawOBUHeader *)0x0) {
    return MPP_ERR_NOMEM;
  }
  mpp_set_bitread_ctx((BitReadCtx_t *)&stack0xffffffffffffff68,unit->data,(RK_S32)unit->data_size);
  RVar5 = mpp_get_bits_count((BitReadCtx_t *)&stack0xffffffffffffff68);
  RVar6 = mpp_av1_read_obu_header(ctx,(BitReadCtx_t *)&stack0xffffffffffffff68,current);
  MVar7 = MPP_NOK;
  if (RVar6 < 0) {
    return MPP_NOK;
  }
  if (unit->type != (uint)current->obu_type) {
    in_stack_ffffffffffffff38 = CONCAT44((int)(in_stack_ffffffffffffff38 >> 0x20),0xb19);
    in_R8 = "obu->header.obu_type == unit->type";
    _mpp_log_l(2,"av1d_cbs","Assertion %s failed at %s:%d\n",(char *)0x0,
               "obu->header.obu_type == unit->type","mpp_av1_read_unit",in_stack_ffffffffffffff38);
    if ((mpp_debug._3_1_ & 0x10) != 0) goto LAB_001c2ace;
  }
  if (current->obu_has_size_field == '\0') {
    if (unit->data_size <= (ulong)current->obu_extension_flag) {
      _mpp_log_l(2,"av1d_cbs","Invalid OBU length: unit too short (%d).\n",(char *)0x0);
      return MPP_NOK;
    }
    in_R8 = (char *)(unit->data_size + ~(ulong)current->obu_extension_flag);
    current[1] = (AV1RawOBUHeader)in_R8;
  }
  else {
    local_b0.obu_forbidden_bit = '\0';
    local_b0.obu_type = '\0';
    local_b0.obu_extension_flag = '\0';
    local_b0.obu_has_size_field = '\0';
    local_b0.obu_reserved_1bit = '\0';
    local_b0.temporal_id = '\0';
    local_b0.spatial_id = '\0';
    local_b0.extension_header_reserved_3bits = '\0';
    MVar7 = mpp_av1_read_leb128((BitReadCtx_t *)&stack0xffffffffffffff68,(RK_U64 *)&local_b0);
    if (MVar7 < MPP_OK) {
      return MVar7;
    }
    current[1] = local_b0;
  }
  uVar8 = mpp_get_bits_count((BitReadCtx_t *)&stack0xffffffffffffff68);
  uVar18 = (ulong)uVar8;
  if (ctx->fist_tile_group == 0) {
    ctx->frame_tag_size = ctx->frame_tag_size + ((int)((uVar8 - RVar5) + 7) >> 3);
  }
  if ((((current->obu_extension_flag != '\0') && (1 < (byte)(current->obu_type - 1))) &&
      (ctx->operating_point_idc != 0)) &&
     (uVar11 = 1 << ((char)ctx->spatial_id + 8U & 0x1f) | 1 << ((byte)ctx->temporal_id & 0x1f),
     (ctx->operating_point_idc & uVar11) != uVar11)) {
    return MPP_ERR_PROTOL;
  }
  local_9c = MVar7;
  if (((byte)av1d_debug & 2) != 0) {
    in_R8._1_1_ = '\0';
    in_R8._2_1_ = '\0';
    in_R8._3_1_ = '\0';
    in_R8._4_1_ = '\0';
    in_R8._5_1_ = '\0';
    in_R8._6_1_ = '\0';
    in_R8._7_1_ = '\0';
    in_R8._0_1_ = current->obu_type;
    _mpp_log_l(4,"av1d_cbs","obu type %d size %d\n","mpp_av1_read_unit",in_R8,current[1]);
  }
  uVar21 = (undefined4)(in_stack_ffffffffffffff38 >> 0x20);
  MVar7 = MPP_ERR_VALUE;
  switch(current->obu_type) {
  case '\x01':
    pAVar4 = (AV1RawSequenceHeader *)(current + 2);
    MVar9 = mpp_av1_read_unsigned
                      ((BitReadCtx_t *)&stack0xffffffffffffff68,3,"seq_profile",(RK_U32 *)&local_b0,
                       0,2);
    uVar21 = (undefined4)(in_stack_ffffffffffffff38 >> 0x20);
    MVar7 = MVar9;
    local_a8 = uVar18;
    _local_40 = pAVar4;
    if (MPP_NOK < MVar9) {
      pAVar4->seq_profile = local_b0.obu_forbidden_bit;
      RVar5 = mpp_av1_read_unsigned
                        ((BitReadCtx_t *)&stack0xffffffffffffff68,1,"still_picture",
                         (RK_U32 *)&local_b0,0,1);
      uVar21 = (undefined4)(in_stack_ffffffffffffff38 >> 0x20);
      if (RVar5 < 0) {
        MVar7 = MPP_NOK;
      }
      else {
        current[2].obu_type = local_b0.obu_forbidden_bit;
        RVar5 = mpp_av1_read_unsigned
                          ((BitReadCtx_t *)&stack0xffffffffffffff68,1,"reduced_still_picture_header"
                           ,(RK_U32 *)&local_b0,0,1);
        uVar21 = (undefined4)(in_stack_ffffffffffffff38 >> 0x20);
        if (RVar5 < 0) {
          MVar7 = MPP_NOK;
        }
        else {
          current[2].obu_extension_flag = local_b0.obu_forbidden_bit;
          if (current[2].obu_extension_flag == '\0') {
            RVar5 = mpp_av1_read_unsigned
                              ((BitReadCtx_t *)&stack0xffffffffffffff68,1,"timing_info_present_flag"
                               ,(RK_U32 *)&local_b0,0,1);
            uVar21 = (undefined4)(in_stack_ffffffffffffff38 >> 0x20);
            if (-1 < RVar5) {
              current[2].obu_has_size_field = local_b0.obu_forbidden_bit;
              if (current[2].obu_has_size_field == '\0') {
                current[2].obu_reserved_1bit = '\0';
              }
              else {
                MVar7 = mpp_av1_read_unsigned
                                  ((BitReadCtx_t *)&stack0xffffffffffffff68,0x20,
                                   "num_units_in_display_tick",(RK_U32 *)&local_b0,1,0xffffffff);
                AVar10 = local_b0;
                if (MPP_NOK < MVar7) {
                  current[3].obu_forbidden_bit = local_b0.obu_forbidden_bit;
                  current[3].obu_type = local_b0.obu_type;
                  current[3].obu_extension_flag = local_b0.obu_extension_flag;
                  current[3].obu_has_size_field = local_b0.obu_has_size_field;
                  local_b0 = AVar10;
                  RVar5 = mpp_av1_read_unsigned
                                    ((BitReadCtx_t *)&stack0xffffffffffffff68,0x20,"time_scale",
                                     (RK_U32 *)&local_b0,1,0xffffffff);
                  AVar10 = local_b0;
                  if (-1 < RVar5) {
                    current[3].obu_reserved_1bit = local_b0.obu_forbidden_bit;
                    current[3].temporal_id = local_b0.obu_type;
                    current[3].spatial_id = local_b0.obu_extension_flag;
                    current[3].extension_header_reserved_3bits = local_b0.obu_has_size_field;
                    local_b0 = AVar10;
                    RVar5 = mpp_av1_read_unsigned
                                      ((BitReadCtx_t *)&stack0xffffffffffffff68,1,
                                       "equal_picture_interval",(RK_U32 *)&local_b0,0,1);
                    if (-1 < RVar5) {
                      current[4].obu_forbidden_bit = local_b0.obu_forbidden_bit;
                      if (current[4].obu_forbidden_bit != '\0') {
                        mpp_read_ue((BitReadCtx_t *)&stack0xffffffffffffff68,(RK_U32 *)&local_b0);
                        AVar10 = local_b0;
                        if (local_b0._0_4_ == -1) {
                          in_stack_ffffffffffffff38 = in_stack_ffffffffffffff38 & 0xffffffff00000000
                          ;
                          _mpp_log_l(2,"av1d_cbs","%s out of range: %d, but must be in [%d,%d].\n",
                                     "mpp_av1_read_uvlc","num_ticks_per_picture_minus_1",0xffffffff,
                                     in_stack_ffffffffffffff38,0xfffffffe);
                          MVar7 = MPP_NOK;
                          goto LAB_001c19dd;
                        }
                        current[4].obu_reserved_1bit = local_b0.obu_forbidden_bit;
                        current[4].temporal_id = local_b0.obu_type;
                        current[4].spatial_id = local_b0.obu_extension_flag;
                        current[4].extension_header_reserved_3bits = local_b0.obu_has_size_field;
                        local_b0 = AVar10;
                      }
                      MVar7 = MPP_OK;
                      goto LAB_001c19dd;
                    }
                  }
                  MVar7 = MPP_NOK;
                }
LAB_001c19dd:
                uVar21 = (undefined4)(in_stack_ffffffffffffff38 >> 0x20);
                if (MVar7 < MPP_OK) goto LAB_001c1d95;
                RVar5 = mpp_av1_read_unsigned
                                  ((BitReadCtx_t *)&stack0xffffffffffffff68,1,
                                   "decoder_model_info_present_flag",(RK_U32 *)&local_b0,0,1);
                uVar21 = (undefined4)(in_stack_ffffffffffffff38 >> 0x20);
                if (RVar5 < 0) goto LAB_001c1d92;
                current[2].obu_reserved_1bit = local_b0.obu_forbidden_bit;
                if (current[2].obu_reserved_1bit != '\0') {
                  MVar7 = mpp_av1_decoder_model_info
                                    ((AV1Context *)&stack0xffffffffffffff68,
                                     (BitReadCtx_t *)(current + 5),current_00);
                  uVar21 = (undefined4)(in_stack_ffffffffffffff38 >> 0x20);
                  if (MVar7 < MPP_OK) goto LAB_001c1d95;
                }
              }
              RVar5 = mpp_av1_read_unsigned
                                ((BitReadCtx_t *)&stack0xffffffffffffff68,1,
                                 "initial_display_delay_present_flag",(RK_U32 *)&local_b0,0,1);
              uVar21 = (undefined4)(in_stack_ffffffffffffff38 >> 0x20);
              if (-1 < RVar5) {
                current[2].temporal_id = local_b0.obu_forbidden_bit;
                RVar5 = mpp_av1_read_unsigned
                                  ((BitReadCtx_t *)&stack0xffffffffffffff68,5,
                                   "operating_points_cnt_minus_1",(RK_U32 *)&local_b0,0,0x1f);
                uVar21 = (undefined4)(in_stack_ffffffffffffff38 >> 0x20);
                if (-1 < RVar5) {
                  current[2].spatial_id = local_b0.obu_forbidden_bit;
                  uVar18 = 0xffffffffffffffff;
                  do {
                    RVar5 = mpp_av1_read_unsigned
                                      ((BitReadCtx_t *)&stack0xffffffffffffff68,0xc,
                                       "operating_point_idc[i]",(RK_U32 *)&local_b0,0,0xfff);
                    uVar21 = (undefined4)(in_stack_ffffffffffffff38 >> 0x20);
                    if (RVar5 < 0) {
                      MVar7 = MPP_NOK;
                      goto LAB_001c1d95;
                    }
                    *(undefined2 *)(&current[6].spatial_id + uVar18 * 2) = local_b0._0_2_;
                    RVar5 = mpp_av1_read_unsigned
                                      ((BitReadCtx_t *)&stack0xffffffffffffff68,5,"seq_level_idx[i]"
                                       ,(RK_U32 *)&local_b0,0,0x1f);
                    uVar21 = (undefined4)(in_stack_ffffffffffffff38 >> 0x20);
                    if (RVar5 < 0) {
                      MVar7 = MPP_NOK;
                      goto LAB_001c1d95;
                    }
                    (&current[0xe].temporal_id)[uVar18] = local_b0.obu_forbidden_bit;
                    if ((&current[0xe].temporal_id)[uVar18] < 8) {
                      (&current[0x12].temporal_id)[uVar18] = '\0';
                    }
                    else {
                      RVar5 = mpp_av1_read_unsigned
                                        ((BitReadCtx_t *)&stack0xffffffffffffff68,1,"seq_tier[i]",
                                         (RK_U32 *)&local_b0,0,1);
                      uVar21 = (undefined4)(in_stack_ffffffffffffff38 >> 0x20);
                      if (RVar5 < 0) {
                        MVar7 = MPP_NOK;
                        goto LAB_001c1d95;
                      }
                      (&current[0x12].temporal_id)[uVar18] = local_b0.obu_forbidden_bit;
                    }
                    if (current[2].obu_reserved_1bit == '\0') {
                      (&current[0x16].temporal_id)[uVar18] = '\0';
                    }
                    else {
                      RVar5 = mpp_av1_read_unsigned
                                        ((BitReadCtx_t *)&stack0xffffffffffffff68,1,
                                         "decoder_model_present_for_this_op[i]",(RK_U32 *)&local_b0,
                                         0,1);
                      uVar21 = (undefined4)(in_stack_ffffffffffffff38 >> 0x20);
                      if (RVar5 < 0) {
                        MVar7 = MPP_NOK;
                        goto LAB_001c1d95;
                      }
                      (&current[0x16].temporal_id)[uVar18] = local_b0.obu_forbidden_bit;
                      if ((&current[0x16].temporal_id)[uVar18] != '\0') {
                        local_38 = (AV1RawSequenceHeader *)((ulong)current[5].obu_forbidden_bit + 1)
                        ;
                        uVar8 = ~(uint)(-1L << ((byte)local_38 & 0x3f));
                        RVar5 = mpp_av1_read_unsigned
                                          ((BitReadCtx_t *)&stack0xffffffffffffff68,(RK_S32)local_38
                                           ,"decoder_buffer_delay[i]",(RK_U32 *)&local_b0,0,uVar8);
                        if (RVar5 < 0) {
                          MVar7 = MPP_NOK;
                          bVar20 = false;
                        }
                        else {
                          *(undefined4 *)(&current[0x1b].obu_forbidden_bit + uVar18 * 4) =
                               local_b0._0_4_;
                          RVar5 = mpp_av1_read_unsigned
                                            ((BitReadCtx_t *)&stack0xffffffffffffff68,
                                             (RK_S32)local_38,"encoder_buffer_delay[i]",
                                             (RK_U32 *)&local_b0,0,uVar8);
                          if (RVar5 < 0) {
                            MVar7 = MPP_NOK;
                          }
                          else {
                            *(undefined4 *)(&current[0x2b].obu_forbidden_bit + uVar18 * 4) =
                                 local_b0._0_4_;
                            MVar7 = MVar9;
                          }
                          if (RVar5 < 0) {
                            bVar20 = false;
                          }
                          else {
                            RVar5 = mpp_av1_read_unsigned
                                              ((BitReadCtx_t *)&stack0xffffffffffffff68,1,
                                               "low_delay_mode_flag[i]",(RK_U32 *)&local_b0,0,1);
                            bVar20 = RVar5 >= 0;
                            if (RVar5 < 0) {
                              MVar7 = MPP_NOK;
                            }
                            else {
                              (&current[0x3a].temporal_id)[uVar18] = local_b0.obu_forbidden_bit;
                            }
                          }
                        }
                        uVar21 = (undefined4)(in_stack_ffffffffffffff38 >> 0x20);
                        MVar9 = MVar7;
                        if (!bVar20) goto LAB_001c1d95;
                      }
                    }
                    if (current[2].temporal_id != '\0') {
                      RVar5 = mpp_av1_read_unsigned
                                        ((BitReadCtx_t *)&stack0xffffffffffffff68,1,
                                         "initial_display_delay_present_for_this_op[i]",
                                         (RK_U32 *)&local_b0,0,1);
                      uVar21 = (undefined4)(in_stack_ffffffffffffff38 >> 0x20);
                      if (RVar5 < 0) {
                        MVar7 = MPP_NOK;
                        goto LAB_001c1d95;
                      }
                      (&current[0x3e].temporal_id)[uVar18] = local_b0.obu_forbidden_bit;
                      if ((&current[0x3e].temporal_id)[uVar18] != '\0') {
                        RVar5 = mpp_av1_read_unsigned
                                          ((BitReadCtx_t *)&stack0xffffffffffffff68,4,
                                           "initial_display_delay_minus_1[i]",(RK_U32 *)&local_b0,0,
                                           0xf);
                        uVar21 = (undefined4)(in_stack_ffffffffffffff38 >> 0x20);
                        if (RVar5 < 0) {
                          MVar7 = MPP_NOK;
                          goto LAB_001c1d95;
                        }
                        (&current[0x42].temporal_id)[uVar18] = local_b0.obu_forbidden_bit;
                      }
                    }
                    uVar21 = (undefined4)(in_stack_ffffffffffffff38 >> 0x20);
                    uVar18 = uVar18 + 1;
                  } while (uVar18 < current[2].spatial_id);
                  goto LAB_001c13a2;
                }
              }
            }
LAB_001c1d92:
            MVar7 = MPP_NOK;
          }
          else {
            current[6].obu_reserved_1bit = '\0';
            current[6].temporal_id = '\0';
            current[2].obu_has_size_field = '\0';
            current[2].obu_reserved_1bit = '\0';
            current[2].temporal_id = '\0';
            current[2].spatial_id = '\0';
            RVar5 = mpp_av1_read_unsigned
                              ((BitReadCtx_t *)&stack0xffffffffffffff68,5,"seq_level_idx[0]",
                               (RK_U32 *)&local_b0,0,0x1f);
            if (RVar5 < 0) {
              MVar7 = MPP_NOK;
            }
            else {
              current[0xe].obu_reserved_1bit = local_b0.obu_forbidden_bit;
              current[0x12].obu_reserved_1bit = '\0';
              current[0x16].obu_reserved_1bit = '\0';
              current[0x3e].obu_reserved_1bit = '\0';
LAB_001c13a2:
              RVar5 = mpp_av1_read_unsigned
                                ((BitReadCtx_t *)&stack0xffffffffffffff68,4,
                                 "frame_width_bits_minus_1",(RK_U32 *)&local_b0,0,0xf);
              if (RVar5 < 0) {
                MVar7 = MPP_NOK;
              }
              else {
                current[0x46].obu_reserved_1bit = local_b0.obu_forbidden_bit;
                RVar5 = mpp_av1_read_unsigned
                                  ((BitReadCtx_t *)&stack0xffffffffffffff68,4,
                                   "frame_height_bits_minus_1",(RK_U32 *)&local_b0,0,0xf);
                if (RVar5 < 0) {
                  MVar7 = MPP_NOK;
                }
                else {
                  current[0x46].temporal_id = local_b0.obu_forbidden_bit;
                  iVar15 = current[0x46].obu_reserved_1bit + 1;
                  RVar5 = mpp_av1_read_unsigned
                                    ((BitReadCtx_t *)&stack0xffffffffffffff68,iVar15,
                                     "max_frame_width_minus_1",(RK_U32 *)&local_b0,0,
                                     ~(uint)(-1L << ((byte)iVar15 & 0x3f)));
                  AVar10 = local_b0;
                  if (RVar5 < 0) {
                    MVar7 = MPP_NOK;
                  }
                  else {
                    current[0x46].spatial_id = local_b0.obu_forbidden_bit;
                    current[0x46].extension_header_reserved_3bits = local_b0.obu_type;
                    iVar15 = current[0x46].temporal_id + 1;
                    local_b0 = AVar10;
                    RVar5 = mpp_av1_read_unsigned
                                      ((BitReadCtx_t *)&stack0xffffffffffffff68,iVar15,
                                       "max_frame_height_minus_1",(RK_U32 *)&local_b0,0,
                                       ~(uint)(-1L << ((byte)iVar15 & 0x3f)));
                    AVar10 = local_b0;
                    if (RVar5 < 0) {
                      MVar7 = MPP_NOK;
                    }
                    else {
                      current[0x47].obu_forbidden_bit = local_b0.obu_forbidden_bit;
                      current[0x47].obu_type = local_b0.obu_type;
                      local_b0 = AVar10;
                      if (current[2].obu_extension_flag == '\0') {
                        RVar5 = mpp_av1_read_unsigned
                                          ((BitReadCtx_t *)&stack0xffffffffffffff68,1,
                                           "frame_id_numbers_present_flag",(RK_U32 *)&local_b0,0,1);
                        if (RVar5 < 0) {
                          MVar7 = MPP_NOK;
                          goto LAB_001c1d95;
                        }
                        current[0x47].obu_extension_flag = local_b0.obu_forbidden_bit;
                      }
                      else {
                        current[0x47].obu_extension_flag = '\0';
                      }
                      if (current[0x47].obu_extension_flag == '\0') {
LAB_001c208b:
                        RVar5 = mpp_av1_read_unsigned
                                          ((BitReadCtx_t *)&stack0xffffffffffffff68,1,
                                           "use_128x128_superblock",(RK_U32 *)&local_b0,0,1);
                        if (RVar5 < 0) {
                          MVar7 = MPP_NOK;
                        }
                        else {
                          current[0x47].temporal_id = local_b0.obu_forbidden_bit;
                          RVar5 = mpp_av1_read_unsigned
                                            ((BitReadCtx_t *)&stack0xffffffffffffff68,1,
                                             "enable_filter_intra",(RK_U32 *)&local_b0,0,1);
                          if (RVar5 < 0) {
                            MVar7 = MPP_NOK;
                          }
                          else {
                            current[0x47].spatial_id = local_b0.obu_forbidden_bit;
                            RVar5 = mpp_av1_read_unsigned
                                              ((BitReadCtx_t *)&stack0xffffffffffffff68,1,
                                               "enable_intra_edge_filter",(RK_U32 *)&local_b0,0,1);
                            if (RVar5 < 0) {
                              MVar7 = MPP_NOK;
                            }
                            else {
                              current[0x47].extension_header_reserved_3bits =
                                   local_b0.obu_forbidden_bit;
                              if (current[2].obu_extension_flag != '\0') {
                                current[0x48].obu_has_size_field = '\0';
                                current[0x48].obu_reserved_1bit = '\0';
                                current[0x48].temporal_id = '\0';
                                current[0x48].spatial_id = '\0';
                                current[0x48].obu_forbidden_bit = '\0';
                                current[0x48].obu_type = '\0';
                                current[0x48].obu_extension_flag = '\0';
                                current[0x48].obu_has_size_field = '\0';
                                current[0x49].obu_forbidden_bit = '\x02';
                                current[0x49].obu_extension_flag = '\x02';
                                goto LAB_001c23ae;
                              }
                              RVar5 = mpp_av1_read_unsigned
                                                ((BitReadCtx_t *)&stack0xffffffffffffff68,1,
                                                 "enable_interintra_compound",(RK_U32 *)&local_b0,0,
                                                 1);
                              if (RVar5 < 0) {
                                MVar7 = MPP_NOK;
                              }
                              else {
                                current[0x48].obu_forbidden_bit = local_b0.obu_forbidden_bit;
                                RVar5 = mpp_av1_read_unsigned
                                                  ((BitReadCtx_t *)&stack0xffffffffffffff68,1,
                                                   "enable_masked_compound",(RK_U32 *)&local_b0,0,1)
                                ;
                                if (RVar5 < 0) {
                                  MVar7 = MPP_NOK;
                                }
                                else {
                                  current[0x48].obu_type = local_b0.obu_forbidden_bit;
                                  RVar5 = mpp_av1_read_unsigned
                                                    ((BitReadCtx_t *)&stack0xffffffffffffff68,1,
                                                     "enable_warped_motion",(RK_U32 *)&local_b0,0,1)
                                  ;
                                  if (RVar5 < 0) {
                                    MVar7 = MPP_NOK;
                                  }
                                  else {
                                    current[0x48].obu_extension_flag = local_b0.obu_forbidden_bit;
                                    RVar5 = mpp_av1_read_unsigned
                                                      ((BitReadCtx_t *)&stack0xffffffffffffff68,1,
                                                       "enable_dual_filter",(RK_U32 *)&local_b0,0,1)
                                    ;
                                    if (RVar5 < 0) {
                                      MVar7 = MPP_NOK;
                                    }
                                    else {
                                      current[0x48].obu_has_size_field = local_b0.obu_forbidden_bit;
                                      RVar5 = mpp_av1_read_unsigned
                                                        ((BitReadCtx_t *)&stack0xffffffffffffff68,1,
                                                         "enable_order_hint",(RK_U32 *)&local_b0,0,1
                                                        );
                                      if (RVar5 < 0) {
                                        MVar7 = MPP_NOK;
                                      }
                                      else {
                                        current[0x48].obu_reserved_1bit = local_b0.obu_forbidden_bit
                                        ;
                                        if (current[0x48].obu_reserved_1bit == '\0') {
                                          current[0x48].temporal_id = '\0';
                                          current[0x48].spatial_id = '\0';
LAB_001c2ae0:
                                          RVar5 = mpp_av1_read_unsigned
                                                            ((BitReadCtx_t *)
                                                             &stack0xffffffffffffff68,1,
                                                             "seq_choose_screen_content_tools",
                                                             (RK_U32 *)&local_b0,0,1);
                                          if (RVar5 < 0) {
                                            MVar7 = MPP_NOK;
                                          }
                                          else {
                                            current[0x48].extension_header_reserved_3bits =
                                                 local_b0.obu_forbidden_bit;
                                            if (current[0x48].extension_header_reserved_3bits ==
                                                '\0') {
                                              RVar5 = mpp_av1_read_unsigned
                                                                ((BitReadCtx_t *)
                                                                 &stack0xffffffffffffff68,1,
                                                                 "seq_force_screen_content_tools",
                                                                 (RK_U32 *)&local_b0,0,1);
                                              if (RVar5 < 0) {
                                                MVar7 = MPP_NOK;
                                                goto LAB_001c1d95;
                                              }
                                              current[0x49].obu_forbidden_bit =
                                                   local_b0.obu_forbidden_bit;
                                            }
                                            else {
                                              current[0x49].obu_forbidden_bit = '\x02';
                                            }
                                            if (current[0x49].obu_forbidden_bit == '\0') {
LAB_001c2bc7:
                                              current[0x49].obu_extension_flag = '\x02';
                                            }
                                            else {
                                              RVar5 = mpp_av1_read_unsigned
                                                                ((BitReadCtx_t *)
                                                                 &stack0xffffffffffffff68,1,
                                                                 "seq_choose_integer_mv",
                                                                 (RK_U32 *)&local_b0,0,1);
                                              if (RVar5 < 0) {
                                                MVar7 = MPP_NOK;
                                                goto LAB_001c1d95;
                                              }
                                              current[0x49].obu_type = local_b0.obu_forbidden_bit;
                                              if (current[0x49].obu_type != '\0') goto LAB_001c2bc7;
                                              RVar5 = mpp_av1_read_unsigned
                                                                ((BitReadCtx_t *)
                                                                 &stack0xffffffffffffff68,1,
                                                                 "seq_force_integer_mv",
                                                                 (RK_U32 *)&local_b0,0,1);
                                              if (RVar5 < 0) {
                                                MVar7 = MPP_NOK;
                                                goto LAB_001c1d95;
                                              }
                                              current[0x49].obu_extension_flag =
                                                   local_b0.obu_forbidden_bit;
                                            }
                                            if (current[0x48].obu_reserved_1bit != '\0') {
                                              RVar5 = mpp_av1_read_unsigned
                                                                ((BitReadCtx_t *)
                                                                 &stack0xffffffffffffff68,3,
                                                                 "order_hint_bits_minus_1",
                                                                 (RK_U32 *)&local_b0,0,7);
                                              if (RVar5 < 0) {
                                                MVar7 = MPP_NOK;
                                                goto LAB_001c1d95;
                                              }
                                              current[0x49].obu_has_size_field =
                                                   local_b0.obu_forbidden_bit;
                                            }
LAB_001c23ae:
                                            RVar5 = mpp_av1_read_unsigned
                                                              ((BitReadCtx_t *)
                                                               &stack0xffffffffffffff68,1,
                                                               "enable_superres",(RK_U32 *)&local_b0
                                                               ,0,1);
                                            if (RVar5 < 0) {
                                              MVar7 = MPP_NOK;
                                            }
                                            else {
                                              current[0x49].obu_reserved_1bit =
                                                   local_b0.obu_forbidden_bit;
                                              RVar5 = mpp_av1_read_unsigned
                                                                ((BitReadCtx_t *)
                                                                 &stack0xffffffffffffff68,1,
                                                                 "enable_cdef",(RK_U32 *)&local_b0,0
                                                                 ,1);
                                              if (RVar5 < 0) {
                                                MVar7 = MPP_NOK;
                                              }
                                              else {
                                                current[0x49].temporal_id =
                                                     local_b0.obu_forbidden_bit;
                                                RVar5 = mpp_av1_read_unsigned
                                                                  ((BitReadCtx_t *)
                                                                   &stack0xffffffffffffff68,1,
                                                                   "enable_restoration",
                                                                   (RK_U32 *)&local_b0,0,1);
                                                if (RVar5 < 0) {
                                                  MVar7 = MPP_NOK;
                                                }
                                                else {
                                                  current[0x49].spatial_id =
                                                       local_b0.obu_forbidden_bit;
                                                  MVar7 = mpp_av1_color_config
                                                                    (ctx,(BitReadCtx_t *)
                                                                         &stack0xffffffffffffff68,
                                                                     (AV1RawColorConfig *)
                                                                     &current[0x49].
                                                                                                                                            
                                                  extension_header_reserved_3bits,
                                                  (uint)current[2].obu_forbidden_bit);
                                                  if (MPP_NOK < MVar7) {
                                                    MVar7 = MPP_OK;
                                                    RVar5 = mpp_av1_read_unsigned
                                                                      ((BitReadCtx_t *)
                                                                       &stack0xffffffffffffff68,1,
                                                                       "film_grain_params_present",
                                                                       (RK_U32 *)&local_b0,0,1);
                                                    if (RVar5 < 0) {
                                                      MVar7 = MPP_NOK;
                                                    }
                                                    else {
                                                      current[0x4b].obu_has_size_field =
                                                           local_b0.obu_forbidden_bit;
                                                    }
                                                  }
                                                }
                                              }
                                            }
                                          }
                                        }
                                        else {
                                          RVar5 = mpp_av1_read_unsigned
                                                            ((BitReadCtx_t *)
                                                             &stack0xffffffffffffff68,1,
                                                             "enable_jnt_comp",(RK_U32 *)&local_b0,0
                                                             ,1);
                                          if (RVar5 < 0) {
                                            MVar7 = MPP_NOK;
                                          }
                                          else {
                                            current[0x48].temporal_id = local_b0.obu_forbidden_bit;
                                            RVar5 = mpp_av1_read_unsigned
                                                              ((BitReadCtx_t *)
                                                               &stack0xffffffffffffff68,1,
                                                               "enable_ref_frame_mvs",
                                                               (RK_U32 *)&local_b0,0,1);
                                            if (-1 < RVar5) {
                                              current[0x48].spatial_id = local_b0.obu_forbidden_bit;
                                              goto LAB_001c2ae0;
                                            }
                                            MVar7 = MPP_NOK;
                                          }
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                      else {
                        RVar5 = mpp_av1_read_unsigned
                                          ((BitReadCtx_t *)&stack0xffffffffffffff68,4,
                                           "delta_frame_id_length_minus_2",(RK_U32 *)&local_b0,0,0xf
                                          );
                        if (RVar5 < 0) {
                          MVar7 = MPP_NOK;
                        }
                        else {
                          current[0x47].obu_has_size_field = local_b0.obu_forbidden_bit;
                          RVar5 = mpp_av1_read_unsigned
                                            ((BitReadCtx_t *)&stack0xffffffffffffff68,3,
                                             "additional_frame_id_length_minus_1",
                                             (RK_U32 *)&local_b0,0,7);
                          if (-1 < RVar5) {
                            current[0x47].obu_reserved_1bit = local_b0.obu_forbidden_bit;
                            goto LAB_001c208b;
                          }
                          MVar7 = MPP_NOK;
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
LAB_001c1d95:
    if (MVar7 < MPP_OK) {
      return MVar7;
    }
    ctx->frame_tag_size = ctx->frame_tag_size + *(int *)(current + 1);
    uVar11 = ctx->operating_point;
    if ((long)(int)uVar11 < 0) {
      uVar8 = (uint)local_a8;
    }
    else {
      bVar1 = current[2].spatial_id;
      if ((int)(uint)bVar1 < (int)uVar11) {
        _mpp_log_l(2,"av1d_cbs",
                   "Invalid Operating Point %d requested. Must not be higher than %u.\n",(char *)0x0
                   ,(ulong)uVar11,(ulong)(uint)bVar1);
        local_9c = MPP_ERR_PROTOL;
      }
      else {
        ctx->operating_point_idc =
             (uint)*(ushort *)(&current[6].obu_reserved_1bit + (long)(int)uVar11 * 2);
      }
      uVar8 = (uint)local_a8;
      if ((int)(uint)bVar1 < (int)uVar11) {
        return local_9c;
      }
    }
    ctx->sequence_header = _local_40;
    break;
  case '\x02':
    ctx->seen_frame_header = 0;
    break;
  case '\x03':
  case '\a':
    MVar7 = mpp_av1_frame_header_obu
                      (ctx,(BitReadCtx_t *)&stack0xffffffffffffff68,
                       (AV1RawFrameHeader *)(current + 2),(uint)(current->obu_type == '\a'),in_R8);
    if (MVar7 < MPP_OK) {
      return MVar7;
    }
    ctx->frame_tag_size = ctx->frame_tag_size + *(int *)(current + 1);
    break;
  case '\x04':
    RVar5 = mpp_get_bits_count((BitReadCtx_t *)&stack0xffffffffffffff68);
    MVar7 = mpp_av1_tile_group_obu
                      (ctx,(BitReadCtx_t *)&stack0xffffffffffffff68,(AV1RawTileGroup *)(current + 2)
                      );
    if (MVar7 < MPP_OK) {
      bVar20 = false;
      local_9c = MVar7;
    }
    else {
      if (ctx->fist_tile_group == 0) {
        RVar6 = mpp_get_bits_count((BitReadCtx_t *)&stack0xffffffffffffff68);
        ctx->frame_tag_size = ctx->frame_tag_size + ((RVar6 - RVar5) + 7U >> 3);
      }
      ctx->fist_tile_group = 1;
      RVar5 = mpp_av1_ref_tile_data
                        (unit,(BitReadCtx_t *)&stack0xffffffffffffff68,
                         (AV1RawTileData *)(current + 3));
      bVar20 = -1 < RVar5;
      if (!bVar20) {
        local_9c = MPP_NOK;
      }
    }
    if (!bVar20) {
      return local_9c;
    }
    break;
  case '\x05':
    ctx->frame_tag_size = ctx->frame_tag_size + *(int *)(current + 1);
    MVar7 = mpp_av1_read_leb128((BitReadCtx_t *)&stack0xffffffffffffff68,(RK_U64 *)&local_b0);
    uVar21 = (undefined4)(in_stack_ffffffffffffff38 >> 0x20);
    MVar9 = MVar7;
    if (MVar7 < MPP_OK) goto joined_r0x001c0f42;
    current[2] = local_b0;
    if (((byte)av1d_debug & 8) != 0) {
      _mpp_log_l(4,"av1d_cbs","%s meta type %lld\n","mpp_av1_metadata_obu","mpp_av1_metadata_obu");
    }
    uVar21 = (undefined4)(in_stack_ffffffffffffff38 >> 0x20);
    switch(current[2]) {
    case (AV1RawOBUHeader)0x1:
      MVar7 = mpp_av1_read_unsigned
                        ((BitReadCtx_t *)&stack0xffffffffffffff68,0x10,"max_cll",(RK_U32 *)&local_b0
                         ,0,0xffff);
      AVar10 = local_b0;
      if (MPP_NOK < MVar7) {
        current[3].obu_forbidden_bit = local_b0.obu_forbidden_bit;
        current[3].obu_type = local_b0.obu_type;
        local_b0 = AVar10;
        RVar5 = mpp_av1_read_unsigned
                          ((BitReadCtx_t *)&stack0xffffffffffffff68,0x10,"max_fall",
                           (RK_U32 *)&local_b0,0,0xffff);
        AVar10 = local_b0;
        if (-1 < RVar5) {
          current[3].obu_extension_flag = local_b0.obu_forbidden_bit;
          current[3].obu_has_size_field = local_b0.obu_type;
          (ctx->content_light).MaxCLL = *(RK_U16 *)(current + 3);
          (ctx->content_light).MaxFALL = *(RK_U16 *)&current[3].obu_extension_flag;
          local_b0 = AVar10;
          goto LAB_001c27db;
        }
        MVar7 = MPP_NOK;
      }
      break;
    case (AV1RawOBUHeader)0x2:
      lVar16 = -6;
      local_a8 = uVar18;
      do {
        RVar5 = mpp_av1_read_unsigned
                          ((BitReadCtx_t *)&stack0xffffffffffffff68,0x10,"primary_chromaticity_x[i]"
                           ,(RK_U32 *)&local_b0,0,0xffff);
        uVar21 = (undefined4)(in_stack_ffffffffffffff38 >> 0x20);
        if (RVar5 < 0) goto LAB_001c1368;
        *(undefined2 *)(&current[3].spatial_id + lVar16) = local_b0._0_2_;
        RVar5 = mpp_av1_read_unsigned
                          ((BitReadCtx_t *)&stack0xffffffffffffff68,0x10,"primary_chromaticity_y[i]"
                           ,(RK_U32 *)&local_b0,0,0xffff);
        uVar21 = (undefined4)(in_stack_ffffffffffffff38 >> 0x20);
        if (RVar5 < 0) goto LAB_001c1368;
        *(undefined2 *)(&current[4].obu_reserved_1bit + lVar16) = local_b0._0_2_;
        lVar16 = lVar16 + 2;
      } while (lVar16 != 0);
      RVar5 = mpp_av1_read_unsigned
                        ((BitReadCtx_t *)&stack0xffffffffffffff68,0x10,"white_point_chromaticity_x",
                         (RK_U32 *)&local_b0,0,0xffff);
      AVar10 = local_b0;
      if (RVar5 < 0) {
LAB_001c1368:
        MVar7 = MPP_NOK;
        bVar20 = true;
        uVar8 = (uint)local_a8;
      }
      else {
        current[4].obu_reserved_1bit = local_b0.obu_forbidden_bit;
        current[4].temporal_id = local_b0.obu_type;
        local_b0 = AVar10;
        RVar5 = mpp_av1_read_unsigned
                          ((BitReadCtx_t *)&stack0xffffffffffffff68,0x10,
                           "white_point_chromaticity_y",(RK_U32 *)&local_b0,0,0xffff);
        AVar10 = local_b0;
        uVar8 = (uint)local_a8;
        if (-1 < RVar5) {
          current[4].spatial_id = local_b0.obu_forbidden_bit;
          current[4].extension_header_reserved_3bits = local_b0.obu_type;
          local_b0 = AVar10;
          RVar5 = mpp_av1_read_unsigned
                            ((BitReadCtx_t *)&stack0xffffffffffffff68,0x20,"luminance_max",
                             (RK_U32 *)&local_b0,1,0xffffffff);
          AVar10 = local_b0;
          if (-1 < RVar5) {
            uVar18 = (ulong)local_b0 & 0xffffffff;
            current[5].obu_forbidden_bit = local_b0.obu_forbidden_bit;
            current[5].obu_type = local_b0.obu_type;
            current[5].obu_extension_flag = local_b0.obu_extension_flag;
            current[5].obu_has_size_field = local_b0.obu_has_size_field;
            uVar18 = uVar18 * 0x40 - 1;
            if (0xfffffffe < uVar18) {
              uVar18 = 0xffffffff;
            }
            local_b0 = AVar10;
            RVar5 = mpp_av1_read_unsigned
                              ((BitReadCtx_t *)&stack0xffffffffffffff68,0x20,"luminance_min",
                               (RK_U32 *)&local_b0,0,(RK_U32)uVar18);
            AVar10 = local_b0;
            if (-1 < RVar5) {
              current[5].obu_reserved_1bit = local_b0.obu_forbidden_bit;
              current[5].temporal_id = local_b0.obu_type;
              current[5].spatial_id = local_b0.obu_extension_flag;
              current[5].extension_header_reserved_3bits = local_b0.obu_has_size_field;
              lVar16 = 0;
              do {
                (ctx->mastering_display).display_primaries[lVar16][0] =
                     *(RK_U16 *)(&current[3].obu_forbidden_bit + lVar16 * 2);
                (ctx->mastering_display).display_primaries[lVar16][1] =
                     *(RK_U16 *)(&current[3].spatial_id + lVar16 * 2);
                lVar16 = lVar16 + 1;
              } while (lVar16 != 3);
              (ctx->mastering_display).white_point[0] = *(RK_U16 *)&current[4].obu_reserved_1bit;
              (ctx->mastering_display).white_point[1] = *(RK_U16 *)&current[4].spatial_id;
              (ctx->mastering_display).max_luminance = *(RK_U32 *)(current + 5);
              (ctx->mastering_display).min_luminance = local_b0._0_4_;
              bVar20 = false;
              MVar7 = MPP_OK;
              local_b0 = AVar10;
              goto LAB_001c1374;
            }
          }
        }
        MVar7 = MPP_NOK;
        bVar20 = true;
      }
LAB_001c1374:
      MVar9 = MVar7;
      if (bVar20) goto joined_r0x001c0f42;
      goto LAB_001c27e1;
    case (AV1RawOBUHeader)0x3:
      MVar7 = mpp_av1_read_unsigned
                        ((BitReadCtx_t *)&stack0xffffffffffffff68,8,"scalability_mode_idc",
                         (RK_U32 *)&local_b0,0,0xff);
      uVar21 = (undefined4)(in_stack_ffffffffffffff38 >> 0x20);
      if (MPP_NOK < MVar7) {
        current[3].obu_forbidden_bit = local_b0.obu_forbidden_bit;
        bVar20 = local_b0.obu_forbidden_bit != '\x0e';
        if (bVar20) goto LAB_001c27db;
        pAVar4 = ctx->sequence_header;
        if (pAVar4 == (AV1RawSequenceHeader *)0x0) {
          local_a8 = uVar18;
          _mpp_log_l(2,"av1d_cbs",
                     "No sequence header available: unable to parse scalability metadata.\n",
                     "mpp_av1_scalability_structure");
          MVar7 = MPP_ERR_UNKNOW;
        }
        else {
          local_a8 = uVar18;
          MVar7 = mpp_av1_read_unsigned
                            ((BitReadCtx_t *)&stack0xffffffffffffff68,2,"spatial_layers_cnt_minus_1"
                             ,(RK_U32 *)&local_b0,0,3);
          uVar21 = (undefined4)(in_stack_ffffffffffffff38 >> 0x20);
          if (MPP_NOK < MVar7) {
            current[3].obu_type = local_b0.obu_forbidden_bit;
            RVar5 = mpp_av1_read_unsigned
                              ((BitReadCtx_t *)&stack0xffffffffffffff68,1,
                               "spatial_layer_dimensions_present_flag",(RK_U32 *)&local_b0,0,1);
            uVar21 = (undefined4)(in_stack_ffffffffffffff38 >> 0x20);
            if (RVar5 < 0) {
              MVar7 = MPP_NOK;
            }
            else {
              current[3].obu_extension_flag = local_b0.obu_forbidden_bit;
              RVar5 = mpp_av1_read_unsigned
                                ((BitReadCtx_t *)&stack0xffffffffffffff68,1,
                                 "spatial_layer_description_present_flag",(RK_U32 *)&local_b0,0,1);
              uVar21 = (undefined4)(in_stack_ffffffffffffff38 >> 0x20);
              if (RVar5 < 0) {
                MVar7 = MPP_NOK;
              }
              else {
                current[3].obu_has_size_field = local_b0.obu_forbidden_bit;
                RVar5 = mpp_av1_read_unsigned
                                  ((BitReadCtx_t *)&stack0xffffffffffffff68,1,
                                   "temporal_group_description_present_flag",(RK_U32 *)&local_b0,0,1
                                  );
                uVar21 = (undefined4)(in_stack_ffffffffffffff38 >> 0x20);
                if (RVar5 < 0) {
                  MVar7 = MPP_NOK;
                }
                else {
                  current[3].obu_reserved_1bit = local_b0.obu_forbidden_bit;
                  RVar5 = mpp_av1_read_unsigned
                                    ((BitReadCtx_t *)&stack0xffffffffffffff68,3,
                                     "scalability_structure_reserved_3bits",(RK_U32 *)&local_b0,0,0)
                  ;
                  uVar21 = (undefined4)(in_stack_ffffffffffffff38 >> 0x20);
                  if (RVar5 < 0) {
                    MVar7 = MPP_NOK;
                  }
                  else {
                    current[3].temporal_id = local_b0.obu_forbidden_bit;
                    if (current[3].obu_extension_flag != '\0') {
                      uVar18 = 0xffffffffffffffff;
                      do {
                        RVar5 = mpp_av1_read_unsigned
                                          ((BitReadCtx_t *)&stack0xffffffffffffff68,0x10,
                                           "spatial_layer_max_width[i]",(RK_U32 *)&local_b0,0,
                                           pAVar4->max_frame_width_minus_1 + 1);
                        uVar21 = (undefined4)(in_stack_ffffffffffffff38 >> 0x20);
                        if (RVar5 < 0) {
                          MVar7 = MPP_NOK;
                          goto LAB_001c27d2;
                        }
                        (&current[3].extension_header_reserved_3bits)[uVar18] =
                             local_b0.obu_forbidden_bit;
                        RVar5 = mpp_av1_read_unsigned
                                          ((BitReadCtx_t *)&stack0xffffffffffffff68,0x10,
                                           "spatial_layer_max_height[i]",(RK_U32 *)&local_b0,0,
                                           pAVar4->max_frame_height_minus_1 + 1);
                        uVar21 = (undefined4)(in_stack_ffffffffffffff38 >> 0x20);
                        if (RVar5 < 0) {
                          MVar7 = MPP_NOK;
                          goto LAB_001c27d2;
                        }
                        (&current[4].obu_has_size_field)[uVar18] = local_b0.obu_forbidden_bit;
                        uVar18 = uVar18 + 1;
                      } while (uVar18 < current[3].obu_type);
                    }
                    if (current[3].obu_has_size_field != '\0') {
                      uVar18 = 0xffffffffffffffff;
                      do {
                        RVar5 = mpp_av1_read_unsigned
                                          ((BitReadCtx_t *)&stack0xffffffffffffff68,8,
                                           "spatial_layer_ref_id[i]",(RK_U32 *)&local_b0,0,0xff);
                        uVar21 = (undefined4)(in_stack_ffffffffffffff38 >> 0x20);
                        if (RVar5 < 0) {
                          MVar7 = MPP_NOK;
                          goto LAB_001c27d2;
                        }
                        (&current[4].extension_header_reserved_3bits)[uVar18] =
                             local_b0.obu_forbidden_bit;
                        uVar18 = uVar18 + 1;
                      } while (uVar18 < current[3].obu_type);
                    }
                    uVar21 = (undefined4)(in_stack_ffffffffffffff38 >> 0x20);
                    if (current[3].obu_reserved_1bit == '\0') {
LAB_001c289a:
                      MVar7 = MPP_OK;
                    }
                    else {
                      RVar5 = mpp_av1_read_unsigned
                                        ((BitReadCtx_t *)&stack0xffffffffffffff68,8,
                                         "temporal_group_size",(RK_U32 *)&local_b0,0,0xff);
                      uVar21 = (undefined4)(in_stack_ffffffffffffff38 >> 0x20);
                      if (RVar5 < 0) {
                        MVar7 = MPP_NOK;
                      }
                      else {
                        current[5].obu_extension_flag = local_b0.obu_forbidden_bit;
                        if (current[5].obu_extension_flag == '\0') goto LAB_001c289a;
                        pRVar19 = &current[0x84].extension_header_reserved_3bits;
                        uVar18 = 0;
                        while( true ) {
                          RVar5 = mpp_av1_read_unsigned
                                            ((BitReadCtx_t *)&stack0xffffffffffffff68,3,
                                             "temporal_group_temporal_id[i]",(RK_U32 *)&local_b0,0,7
                                            );
                          uVar21 = (undefined4)(in_stack_ffffffffffffff38 >> 0x20);
                          if (RVar5 < 0) {
                            MVar7 = MPP_NOK;
                            goto LAB_001c27d2;
                          }
                          (&current[5].obu_has_size_field)[uVar18] = local_b0.obu_forbidden_bit;
                          RVar5 = mpp_av1_read_unsigned
                                            ((BitReadCtx_t *)&stack0xffffffffffffff68,1,
                                             "temporal_group_temporal_switching_up_point_flag[i]",
                                             (RK_U32 *)&local_b0,0,1);
                          uVar21 = (undefined4)(in_stack_ffffffffffffff38 >> 0x20);
                          if (RVar5 < 0) break;
                          (&current[0x25].obu_extension_flag)[uVar18] = local_b0.obu_forbidden_bit;
                          RVar5 = mpp_av1_read_unsigned
                                            ((BitReadCtx_t *)&stack0xffffffffffffff68,1,
                                             "temporal_group_spatial_switching_up_point_flag[i]",
                                             (RK_U32 *)&local_b0,0,1);
                          uVar21 = (undefined4)(in_stack_ffffffffffffff38 >> 0x20);
                          if (RVar5 < 0) {
                            MVar7 = MPP_NOK;
                            goto LAB_001c27d2;
                          }
                          (&current[0x45].obu_type)[uVar18] = local_b0.obu_forbidden_bit;
                          RVar5 = mpp_av1_read_unsigned
                                            ((BitReadCtx_t *)&stack0xffffffffffffff68,3,
                                             "temporal_group_ref_cnt[i]",(RK_U32 *)&local_b0,0,7);
                          uVar21 = (undefined4)(in_stack_ffffffffffffff38 >> 0x20);
                          if (RVar5 < 0) {
                            MVar7 = MPP_NOK;
                            goto LAB_001c27d2;
                          }
                          (&current[0x65].obu_forbidden_bit)[uVar18] = local_b0.obu_forbidden_bit;
                          if ((&current[0x65].obu_forbidden_bit)[uVar18] != '\0') {
                            uVar14 = 0;
                            do {
                              RVar5 = mpp_av1_read_unsigned
                                                ((BitReadCtx_t *)&stack0xffffffffffffff68,8,
                                                 "temporal_group_ref_pic_diff[i][j]",
                                                 (RK_U32 *)&local_b0,0,0xff);
                              uVar21 = (undefined4)(in_stack_ffffffffffffff38 >> 0x20);
                              if (RVar5 < 0) {
                                MVar7 = MPP_NOK;
                                goto LAB_001c27d2;
                              }
                              pRVar19[uVar14] = local_b0.obu_forbidden_bit;
                              uVar14 = uVar14 + 1;
                            } while (uVar14 < (&current[0x65].obu_forbidden_bit)[uVar18]);
                          }
                          uVar21 = (undefined4)(in_stack_ffffffffffffff38 >> 0x20);
                          uVar18 = uVar18 + 1;
                          pRVar19 = pRVar19 + 7;
                          MVar7 = MPP_OK;
                          if (current[5].obu_extension_flag <= uVar18) goto LAB_001c27d2;
                        }
                        MVar7 = MPP_NOK;
                      }
                    }
                  }
                }
              }
            }
          }
        }
LAB_001c27d2:
        uVar8 = (uint)local_a8;
        if (MPP_NOK < MVar7) goto LAB_001c27db;
      }
      break;
    case (AV1RawOBUHeader)0x4:
      MVar7 = mpp_av1_read_unsigned
                        ((BitReadCtx_t *)&stack0xffffffffffffff68,8,"itu_t_t35_country_code",
                         (RK_U32 *)&local_b0,0,0xff);
      if (MPP_NOK < MVar7) {
        current[3].obu_forbidden_bit = local_b0.obu_forbidden_bit;
        if (local_b0.obu_forbidden_bit == 0xff) {
          RVar5 = mpp_av1_read_unsigned
                            ((BitReadCtx_t *)&stack0xffffffffffffff68,8,
                             "itu_t_t35_country_code_extension_byte",(RK_U32 *)&local_b0,0,0xff);
          if (RVar5 < 0) {
            MVar7 = MPP_NOK;
            break;
          }
          current[3].obu_type = local_b0.obu_forbidden_bit;
        }
        RVar5 = mpp_get_bits_left((BitReadCtx_t *)&stack0xffffffffffffff68);
        iVar15 = RVar5 + 7;
        if (-1 < RVar5) {
          iVar15 = RVar5;
        }
        AVar10 = (AV1RawOBUHeader)(long)((iVar15 >> 3) + -1);
        current[6] = AVar10;
        if (((byte)av1d_debug & 8) != 0) {
          _mpp_log_l(4,"av1d_cbs","%s itu_t_t35_country_code %d payload_size %d\n",
                     "mpp_av1_metadata_itut_t35","mpp_av1_metadata_itut_t35",
                     (ulong)current[3].obu_forbidden_bit,AVar10);
          uVar21 = AVar10._4_4_;
        }
        RVar5 = mpp_av1_read_unsigned
                          ((BitReadCtx_t *)&stack0xffffffffffffff68,0x10,
                           "itu_t_t35_terminal_provider_code",(RK_U32 *)&local_b0,0,0xffff);
        AVar10 = local_b0;
        if (RVar5 < 0) {
          MVar7 = MPP_NOK;
        }
        else {
          current[3].obu_reserved_1bit = local_b0.obu_forbidden_bit;
          current[3].temporal_id = local_b0.obu_type;
          current[3].spatial_id = local_b0.obu_extension_flag;
          current[3].extension_header_reserved_3bits = local_b0.obu_has_size_field;
          local_b0 = AVar10;
          if (((byte)av1d_debug & 8) != 0) {
            _mpp_log_l(4,"av1d_cbs","itu_t_t35_country_code 0x%x\n","mpp_av1_metadata_itut_t35");
          }
          if (((byte)av1d_debug & 8) != 0) {
            _mpp_log_l(4,"av1d_cbs","itu_t_t35_terminal_provider_code 0x%x\n",
                       "mpp_av1_metadata_itut_t35");
          }
          iVar15._0_1_ = current[3].obu_reserved_1bit;
          iVar15._1_1_ = current[3].temporal_id;
          iVar15._2_1_ = current[3].spatial_id;
          iVar15._3_1_ = current[3].extension_header_reserved_3bits;
          if (iVar15 == 0x3c) {
            RVar5 = mpp_av1_read_unsigned
                              ((BitReadCtx_t *)&stack0xffffffffffffff68,0x10,
                               "itu_t_t35_terminal_provider_oriented_code",(RK_U32 *)&local_b0,0,
                               0xffff);
            AVar10 = local_b0;
            if (RVar5 < 0) {
              MVar7 = MPP_NOK;
              iVar15 = 1;
            }
            else {
              current[4].obu_forbidden_bit = local_b0.obu_forbidden_bit;
              current[4].obu_type = local_b0.obu_type;
              current[4].obu_extension_flag = local_b0.obu_extension_flag;
              current[4].obu_has_size_field = local_b0.obu_has_size_field;
              hdr_fmt = local_b0._0_4_;
              local_b0 = AVar10;
              local_a8 = uVar18;
              if (((byte)av1d_debug & 8) != 0) {
                uVar8._0_1_ = current[4].obu_forbidden_bit;
                uVar8._1_1_ = current[4].obu_type;
                uVar8._2_1_ = current[4].obu_extension_flag;
                uVar8._3_1_ = current[4].obu_has_size_field;
                hdr_fmt = 0x292868;
                _mpp_log_l(4,"av1d_cbs","itu_t_t35_terminal_provider_oriented_code 0x%x\n",
                           "mpp_av1_metadata_itut_t35",(ulong)uVar8);
              }
              local_54 = mpp_read_bits((BitReadCtx_t *)&stack0xffffffffffffff68,8,
                                       (RK_S32 *)&local_b0);
              iVar15 = 0x17;
              if (local_54 == MPP_OK) {
                iVar15 = 0;
              }
              uVar8 = (uint)local_a8;
              if (local_54 == MPP_OK) {
                iVar15 = 0;
                iVar3._0_1_ = current[4].obu_forbidden_bit;
                iVar3._1_1_ = current[4].obu_type;
                iVar3._2_1_ = current[4].obu_extension_flag;
                iVar3._3_1_ = current[4].obu_has_size_field;
                if ((iVar3 == 1) && (local_b0.obu_forbidden_bit == '\x04')) {
                  RVar5 = mpp_get_bits_left((BitReadCtx_t *)&stack0xffffffffffffff68);
                  mpp_av1_fill_dynamic_meta(ctx,local_98,RVar5 >> 3,hdr_fmt);
                }
                uVar8 = (uint)local_a8;
              }
            }
            if ((iVar15 != 0x17) && (iVar15 != 0)) break;
          }
          else if (iVar15 == 0x3b) {
            local_a8 = uVar18;
            local_54 = mpp_read_longbits((BitReadCtx_t *)&stack0xffffffffffffff68,0x20,
                                         (RK_U32 *)&local_b0);
            AVar10 = local_b0;
            iVar15 = 0x17;
            if (local_54 == MPP_OK) {
              current[4].obu_forbidden_bit = local_b0.obu_forbidden_bit;
              current[4].obu_type = local_b0.obu_type;
              current[4].obu_extension_flag = local_b0.obu_extension_flag;
              current[4].obu_has_size_field = local_b0.obu_has_size_field;
              iVar15 = 0;
            }
            uVar8 = (uint)local_a8;
            local_b0 = AVar10;
            if (iVar15 != 0x17) {
              if (iVar15 != 0) break;
              if (((byte)av1d_debug & 8) != 0) {
                uVar11._0_1_ = current[4].obu_forbidden_bit;
                uVar11._1_1_ = current[4].obu_type;
                uVar11._2_1_ = current[4].obu_extension_flag;
                uVar11._3_1_ = current[4].obu_has_size_field;
                _mpp_log_l(4,"av1d_cbs","itu_t_t35_terminal_provider_oriented_code 0x%x\n",
                           "mpp_av1_metadata_itut_t35",(ulong)uVar11);
              }
              iVar2._0_1_ = current[4].obu_forbidden_bit;
              iVar2._1_1_ = current[4].obu_type;
              iVar2._2_1_ = current[4].obu_extension_flag;
              iVar2._3_1_ = current[4].obu_has_size_field;
              if (iVar2 == 0x800) {
                mpp_av1_get_dolby_rpu(ctx,(BitReadCtx_t *)&stack0xffffffffffffff68);
              }
            }
          }
LAB_001c27db:
          MVar7 = MPP_OK;
        }
      }
      break;
    case (AV1RawOBUHeader)0x5:
      MVar7 = mpp_av1_read_unsigned
                        ((BitReadCtx_t *)&stack0xffffffffffffff68,5,"counting_type",
                         (RK_U32 *)&local_b0,0,0x1f);
      if (MPP_NOK < MVar7) {
        current[3].obu_forbidden_bit = local_b0.obu_forbidden_bit;
        RVar5 = mpp_av1_read_unsigned
                          ((BitReadCtx_t *)&stack0xffffffffffffff68,1,"full_timestamp_flag",
                           (RK_U32 *)&local_b0,0,1);
        if (RVar5 < 0) {
          MVar7 = MPP_NOK;
        }
        else {
          current[3].obu_type = local_b0.obu_forbidden_bit;
          RVar5 = mpp_av1_read_unsigned
                            ((BitReadCtx_t *)&stack0xffffffffffffff68,1,"discontinuity_flag",
                             (RK_U32 *)&local_b0,0,1);
          if (RVar5 < 0) {
            MVar7 = MPP_NOK;
          }
          else {
            current[3].obu_extension_flag = local_b0.obu_forbidden_bit;
            RVar5 = mpp_av1_read_unsigned
                              ((BitReadCtx_t *)&stack0xffffffffffffff68,1,"cnt_dropped_flag",
                               (RK_U32 *)&local_b0,0,1);
            if (RVar5 < 0) {
              MVar7 = MPP_NOK;
            }
            else {
              current[3].obu_has_size_field = local_b0.obu_forbidden_bit;
              RVar5 = mpp_av1_read_unsigned
                                ((BitReadCtx_t *)&stack0xffffffffffffff68,9,"n_frames",
                                 (RK_U32 *)&local_b0,0,0x1ff);
              if (RVar5 < 0) {
                MVar7 = MPP_NOK;
              }
              else {
                current[3].obu_reserved_1bit = local_b0.obu_forbidden_bit;
                if (current[3].obu_type == '\0') {
                  RVar5 = mpp_av1_read_unsigned
                                    ((BitReadCtx_t *)&stack0xffffffffffffff68,1,"seconds_flag",
                                     (RK_U32 *)&local_b0,0,1);
                  if (RVar5 < 0) {
                    MVar7 = MPP_NOK;
                  }
                  else {
                    current[4].obu_forbidden_bit = local_b0.obu_forbidden_bit;
                    if (current[4].obu_forbidden_bit == '\0') goto LAB_001c23f6;
                    RVar5 = mpp_av1_read_unsigned
                                      ((BitReadCtx_t *)&stack0xffffffffffffff68,6,"seconds_value",
                                       (RK_U32 *)&local_b0,0,0x3b);
                    if (RVar5 < 0) {
                      MVar7 = MPP_NOK;
                    }
                    else {
                      current[3].temporal_id = local_b0.obu_forbidden_bit;
                      RVar5 = mpp_av1_read_unsigned
                                        ((BitReadCtx_t *)&stack0xffffffffffffff68,1,"minutes_flag",
                                         (RK_U32 *)&local_b0,0,1);
                      if (RVar5 < 0) {
                        MVar7 = MPP_NOK;
                      }
                      else {
                        current[4].obu_type = local_b0.obu_forbidden_bit;
                        if (current[4].obu_type == '\0') {
LAB_001c23f6:
                          RVar5 = mpp_av1_read_unsigned
                                            ((BitReadCtx_t *)&stack0xffffffffffffff68,5,
                                             "time_offset_length",(RK_U32 *)&local_b0,0,0x1f);
                          if (-1 < RVar5) {
                            current[4].obu_has_size_field = local_b0.obu_forbidden_bit;
                            bVar1 = current[4].obu_has_size_field;
                            if (bVar1 == 0) {
                              current[4].obu_has_size_field = '\0';
                            }
                            else {
                              RVar5 = mpp_av1_read_unsigned
                                                ((BitReadCtx_t *)&stack0xffffffffffffff68,
                                                 (uint)bVar1,"time_offset_value",(RK_U32 *)&local_b0
                                                 ,0,~(uint)(-1L << (bVar1 & 0x3f)));
                              AVar10 = local_b0;
                              if (RVar5 < 0) {
                                MVar7 = MPP_NOK;
                                break;
                              }
                              current[4].obu_reserved_1bit = local_b0.obu_forbidden_bit;
                              current[4].temporal_id = local_b0.obu_type;
                              current[4].spatial_id = local_b0.obu_extension_flag;
                              current[4].extension_header_reserved_3bits =
                                   local_b0.obu_has_size_field;
                              local_b0 = AVar10;
                            }
                            goto LAB_001c27db;
                          }
                          MVar7 = MPP_NOK;
                        }
                        else {
                          RVar5 = mpp_av1_read_unsigned
                                            ((BitReadCtx_t *)&stack0xffffffffffffff68,6,
                                             "minutes_value",(RK_U32 *)&local_b0,0,0x3b);
                          if (RVar5 < 0) {
                            MVar7 = MPP_NOK;
                          }
                          else {
                            current[3].spatial_id = local_b0.obu_forbidden_bit;
                            RVar5 = mpp_av1_read_unsigned
                                              ((BitReadCtx_t *)&stack0xffffffffffffff68,1,
                                               "hours_flag",(RK_U32 *)&local_b0,0,1);
                            if (-1 < RVar5) {
                              current[4].obu_extension_flag = local_b0.obu_forbidden_bit;
                              if (current[4].obu_extension_flag != '\0') goto LAB_001c2198;
                              goto LAB_001c23f6;
                            }
                            MVar7 = MPP_NOK;
                          }
                        }
                      }
                    }
                  }
                }
                else {
                  RVar5 = mpp_av1_read_unsigned
                                    ((BitReadCtx_t *)&stack0xffffffffffffff68,6,"seconds_value",
                                     (RK_U32 *)&local_b0,0,0x3b);
                  if (RVar5 < 0) {
                    MVar7 = MPP_NOK;
                  }
                  else {
                    current[3].temporal_id = local_b0.obu_forbidden_bit;
                    RVar5 = mpp_av1_read_unsigned
                                      ((BitReadCtx_t *)&stack0xffffffffffffff68,6,"minutes_value",
                                       (RK_U32 *)&local_b0,0,0x3b);
                    if (RVar5 < 0) {
                      MVar7 = MPP_NOK;
                    }
                    else {
                      current[3].spatial_id = local_b0.obu_forbidden_bit;
LAB_001c2198:
                      RVar5 = mpp_av1_read_unsigned
                                        ((BitReadCtx_t *)&stack0xffffffffffffff68,5,"hours_value",
                                         (RK_U32 *)&local_b0,0,0x17);
                      if (-1 < RVar5) {
                        current[3].extension_header_reserved_3bits = local_b0.obu_forbidden_bit;
                        goto LAB_001c23f6;
                      }
                      MVar7 = MPP_NOK;
                    }
                  }
                }
              }
            }
          }
        }
      }
      break;
    default:
      _mpp_log_l(2,"av1d_cbs","unknown metadata type %lld\n","mpp_av1_metadata_obu");
      goto LAB_001c27e1;
    }
    MVar9 = MVar7;
    if (MPP_NOK < MVar7) {
LAB_001c27e1:
      MVar7 = MPP_OK;
      MVar9 = MVar7;
    }
    goto joined_r0x001c0f42;
  case '\x06':
    bitctx = (BitReadCtx_t *)&stack0xffffffffffffff68;
    RVar5 = mpp_get_bits_count(bitctx);
    _local_40 = (AV1RawSequenceHeader *)CONCAT44(uStack_3c,RVar5);
    MVar7 = mpp_av1_frame_header_obu(ctx,bitctx,(AV1RawFrameHeader *)(current + 2),0,in_R8);
    if (MPP_NOK < MVar7) {
      mpp_av1_byte_alignment((AV1Context *)&stack0xffffffffffffff68,bitctx);
      RVar5 = mpp_av1_tile_group_obu
                        (ctx,(BitReadCtx_t *)&stack0xffffffffffffff68,
                         (AV1RawTileGroup *)(current + 0x85));
      if (RVar5 < 0) {
        MVar7 = MPP_NOK;
      }
      else {
        RVar5 = mpp_get_bits_count((BitReadCtx_t *)&stack0xffffffffffffff68);
        ctx->frame_tag_size = ctx->frame_tag_size + ((RVar5 - local_40) + 7U >> 3);
        MVar7 = MPP_OK;
      }
    }
    if (MVar7 < MPP_OK) {
      return MVar7;
    }
    MVar9 = mpp_av1_ref_tile_data
                      (unit,(BitReadCtx_t *)&stack0xffffffffffffff68,
                       (AV1RawTileData *)(current + 0x86));
    MVar7 = MPP_NOK;
    goto joined_r0x001c0f42;
  case '\b':
    MVar7 = mpp_av1_read_unsigned
                      ((BitReadCtx_t *)&stack0xffffffffffffff68,8,
                       "output_frame_width_in_tiles_minus_1",(RK_U32 *)&local_b0,0,0xff);
    if (MPP_NOK < MVar7) {
      current[2].obu_forbidden_bit = local_b0.obu_forbidden_bit;
      RVar5 = mpp_av1_read_unsigned
                        ((BitReadCtx_t *)&stack0xffffffffffffff68,8,
                         "output_frame_height_in_tiles_minus_1",(RK_U32 *)&local_b0,0,0xff);
      if (RVar5 < 0) {
        MVar7 = MPP_NOK;
      }
      else {
        current[2].obu_type = local_b0.obu_forbidden_bit;
        MVar7 = MPP_OK;
        RVar5 = mpp_av1_read_unsigned
                          ((BitReadCtx_t *)&stack0xffffffffffffff68,0x10,"tile_count_minus_1",
                           (RK_U32 *)&local_b0,0,0xffff);
        if (RVar5 < 0) {
          MVar7 = MPP_NOK;
        }
        else {
          current[2].obu_extension_flag = local_b0.obu_forbidden_bit;
        }
      }
    }
    if (MVar7 < MPP_OK) {
      return MVar7;
    }
    MVar7 = mpp_av1_ref_tile_data
                      (unit,(BitReadCtx_t *)&stack0xffffffffffffff68,(AV1RawTileData *)(current + 3)
                      );
    MVar9 = MVar7;
joined_r0x001c0f42:
    if (MVar9 < MPP_OK) {
      return MVar7;
    }
    break;
  default:
    goto switchD_001c09fd_caseD_9;
  case '\x0f':
    local_a8 = uVar18;
    RVar5 = mpp_get_bits_left((BitReadCtx_t *)&stack0xffffffffffffff68);
    if (RVar5 < 8) {
      AVar10.obu_forbidden_bit = '\0';
      AVar10.obu_type = '\0';
      AVar10.obu_extension_flag = '\0';
      AVar10.obu_has_size_field = '\0';
      AVar10.obu_reserved_1bit = '\0';
      AVar10.temporal_id = '\0';
      AVar10.spatial_id = '\0';
      AVar10.extension_header_reserved_3bits = '\0';
    }
    else {
      AVar12.obu_forbidden_bit = '\0';
      AVar12.obu_type = '\0';
      AVar12.obu_extension_flag = '\0';
      AVar12.obu_has_size_field = '\0';
      AVar12.obu_reserved_1bit = '\0';
      AVar12.temporal_id = '\0';
      AVar12.spatial_id = '\0';
      AVar12.extension_header_reserved_3bits = '\0';
      AVar10.obu_forbidden_bit = '\0';
      AVar10.obu_type = '\0';
      AVar10.obu_extension_flag = '\0';
      AVar10.obu_has_size_field = '\0';
      AVar10.obu_reserved_1bit = '\0';
      AVar10.temporal_id = '\0';
      AVar10.spatial_id = '\0';
      AVar10.extension_header_reserved_3bits = '\0';
      do {
        local_54 = mpp_read_bits((BitReadCtx_t *)&stack0xffffffffffffff68,8,(RK_S32 *)&local_b0);
        if (local_54 != MPP_OK) {
          AVar10.obu_forbidden_bit = 0xff;
          AVar10.obu_type = 0xff;
          AVar10.obu_extension_flag = 0xff;
          AVar10.obu_has_size_field = 0xff;
          AVar10.obu_reserved_1bit = 0xff;
          AVar10.temporal_id = 0xff;
          AVar10.spatial_id = 0xff;
          AVar10.extension_header_reserved_3bits = 0xff;
          break;
        }
        if (local_b0.obu_forbidden_bit != '\0') {
          AVar10 = AVar12;
        }
        AVar12 = (AV1RawOBUHeader)((long)AVar12 + 1);
        RVar5 = mpp_get_bits_left((BitReadCtx_t *)&stack0xffffffffffffff68);
      } while (7 < RVar5);
    }
    current[3] = AVar10;
    AVar10 = (AV1RawOBUHeader)mpp_osal_malloc("mpp_av1_padding_obu",(size_t)AVar10);
    uVar21 = (undefined4)(in_stack_ffffffffffffff38 >> 0x20);
    current[2] = AVar10;
    bVar20 = true;
    if (AVar10 == (AV1RawOBUHeader)0x0) {
      MVar7 = MPP_ERR_NOMEM;
    }
    else {
      if (current[3] != (AV1RawOBUHeader)0x0) {
        AVar13.obu_forbidden_bit = '\x01';
        AVar13.obu_type = '\0';
        AVar13.obu_extension_flag = '\0';
        AVar13.obu_has_size_field = '\0';
        AVar13.obu_reserved_1bit = '\0';
        AVar13.temporal_id = '\0';
        AVar13.spatial_id = '\0';
        AVar13.extension_header_reserved_3bits = '\0';
        AVar17.obu_forbidden_bit = '\0';
        AVar17.obu_type = '\0';
        AVar17.obu_extension_flag = '\0';
        AVar17.obu_has_size_field = '\0';
        AVar17.obu_reserved_1bit = '\0';
        AVar17.temporal_id = '\0';
        AVar17.spatial_id = '\0';
        AVar17.extension_header_reserved_3bits = '\0';
        do {
          AVar10 = AVar13;
          RVar5 = mpp_av1_read_unsigned
                            ((BitReadCtx_t *)&stack0xffffffffffffff68,8,"obu_padding_byte[i]",
                             (RK_U32 *)&local_b0,0,0xff);
          uVar21 = (undefined4)(in_stack_ffffffffffffff38 >> 0x20);
          if (RVar5 < 0) {
            MVar7 = MPP_NOK;
            bVar20 = true;
            goto LAB_001c0f0d;
          }
          *(RK_U8 *)((long)current[2] + (long)AVar17) = local_b0.obu_forbidden_bit;
          AVar13._0_4_ = AVar10._0_4_ + 1;
          AVar13.obu_reserved_1bit = '\0';
          AVar13.temporal_id = '\0';
          AVar13.spatial_id = '\0';
          AVar13.extension_header_reserved_3bits = '\0';
          AVar17 = AVar10;
        } while ((ulong)AVar10 < (ulong)current[3]);
      }
      bVar20 = false;
      MVar7 = MPP_OK;
    }
LAB_001c0f0d:
    uVar8 = (uint)local_a8;
    if (bVar20) {
      return MVar7;
    }
  }
  RVar6 = mpp_get_bits_count((BitReadCtx_t *)&stack0xffffffffffffff68);
  RVar5 = extraout_EDX;
  if (((int)unit->data_size * 8 < RVar6) &&
     (_mpp_log_l(2,"av1d_cbs","Assertion %s failed at %s:%d\n",(char *)0x0,
                 "end_pos <= (RK_S32)(unit->data_size * 8)","mpp_av1_read_unit",
                 CONCAT44(uVar21,0xb95)), RVar5 = extraout_EDX_00, (mpp_debug._3_1_ & 0x10) != 0)) {
LAB_001c2ace:
    abort();
  }
  if ((current[1] != (AV1RawOBUHeader)0x0) &&
     ((8 < current->obu_type || (RVar5 = 0x150, (0x150U >> (current->obu_type & 0x1f) & 1) == 0))))
  {
    uVar8 = (uVar8 - RVar6) + SUB84(current[1],0) * 8;
    if ((int)uVar8 < 1) {
      return MPP_NOK;
    }
    mpp_av1_trailing_bits((AV1Context *)&stack0xffffffffffffff68,(BitReadCtx_t *)(ulong)uVar8,RVar5)
    ;
  }
  MVar7 = MPP_OK;
switchD_001c09fd_caseD_9:
  return MVar7;
}

Assistant:

MPP_RET mpp_av1_read_unit(AV1Context *ctx, Av1ObuUnit *unit)
{
    AV1RawOBU *obu;
    BitReadCtx_t gbc;
    RK_S32 err = 0, start_pos, end_pos, hdr_start_pos;

    err = mpp_av1_alloc_unit_content(unit);

    if (err < 0)
        return err;

    obu = unit->content;

    mpp_set_bitread_ctx(&gbc, unit->data, unit->data_size);

    hdr_start_pos = mpp_get_bits_count(&gbc);

    err = mpp_av1_read_obu_header(ctx, &gbc, &obu->header);
    if (err < 0)
        return err;
    mpp_assert(obu->header.obu_type == unit->type);

    if (obu->header.obu_has_size_field) {
        RK_U64 obu_size = 0;
        err = mpp_av1_read_leb128(&gbc, &obu_size);
        if (err < 0)
            return err;
        obu->obu_size = obu_size;
    } else {
        if (unit->data_size < (RK_U32)(1 + obu->header.obu_extension_flag)) {
            mpp_err( "Invalid OBU length: "
                     "unit too short (%d).\n", unit->data_size);
            return MPP_NOK;
        }
        obu->obu_size = unit->data_size - 1 - obu->header.obu_extension_flag;
    }

    start_pos = mpp_get_bits_count(&gbc);
    if (!ctx->fist_tile_group)
        ctx->frame_tag_size += ((start_pos - hdr_start_pos + 7) >> 3);
    if (obu->header.obu_extension_flag) {
        if (obu->header.obu_type != AV1_OBU_SEQUENCE_HEADER &&
            obu->header.obu_type != AV1_OBU_TEMPORAL_DELIMITER &&
            ctx->operating_point_idc) {
            RK_S32 in_temporal_layer =
                (ctx->operating_point_idc >>  ctx->temporal_id    ) & 1;
            RK_S32 in_spatial_layer  =
                (ctx->operating_point_idc >> (ctx->spatial_id + 8)) & 1;
            if (!in_temporal_layer || !in_spatial_layer) {
                return MPP_ERR_PROTOL; // drop_obu()
            }
        }
    }
    av1d_dbg(AV1D_DBG_HEADER, "obu type %d size %d\n",
             obu->header.obu_type, obu->obu_size);
    switch (obu->header.obu_type) {
    case AV1_OBU_SEQUENCE_HEADER: {
        err = mpp_av1_sequence_header_obu(ctx, &gbc,
                                          &obu->obu.sequence_header);
        if (err < 0)
            return err;
        ctx->frame_tag_size += obu->obu_size;
        if (ctx->operating_point >= 0) {
            AV1RawSequenceHeader *sequence_header = &obu->obu.sequence_header;

            if (ctx->operating_point > sequence_header->operating_points_cnt_minus_1) {
                mpp_err("Invalid Operating Point %d requested. "
                        "Must not be higher than %u.\n",
                        ctx->operating_point, sequence_header->operating_points_cnt_minus_1);
                return MPP_ERR_PROTOL;
            }
            ctx->operating_point_idc = sequence_header->operating_point_idc[ctx->operating_point];
        }

        ctx->sequence_header = NULL;
        ctx->sequence_header = &obu->obu.sequence_header;
    } break;
    case AV1_OBU_TEMPORAL_DELIMITER: {
        err = mpp_av1_temporal_delimiter_obu(ctx, &gbc);
        if (err < 0)
            return err;
    } break;
    case AV1_OBU_FRAME_HEADER:
    case AV1_OBU_REDUNDANT_FRAME_HEADER: {
        err = mpp_av1_frame_header_obu(ctx, &gbc,
                                       &obu->obu.frame_header,
                                       obu->header.obu_type ==
                                       AV1_OBU_REDUNDANT_FRAME_HEADER,
                                       NULL);
        if (err < 0)
            return err;
        ctx->frame_tag_size += obu->obu_size;
    } break;
    case AV1_OBU_TILE_GROUP: {
        RK_U32 cur_pos = mpp_get_bits_count(&gbc);

        err = mpp_av1_tile_group_obu(ctx, &gbc, &obu->obu.tile_group);
        if (err < 0)
            return err;
        if (!ctx->fist_tile_group)
            ctx->frame_tag_size += MPP_ALIGN(mpp_get_bits_count(&gbc) - cur_pos, 8) / 8;
        ctx->fist_tile_group = 1;
        err = mpp_av1_ref_tile_data(unit, &gbc,
                                    &obu->obu.tile_group.tile_data);
        if (err < 0)
            return err;
    } break;
    case AV1_OBU_FRAME: {
        err = mpp_av1_frame_obu(ctx, &gbc, &obu->obu.frame,
                                NULL);
        if (err < 0)
            return err;

        err = mpp_av1_ref_tile_data(unit, &gbc,
                                    &obu->obu.frame.tile_group.tile_data);
        if (err < 0)
            return err;
    } break;
    case AV1_OBU_TILE_LIST: {
        err = mpp_av1_tile_list_obu(ctx, &gbc, &obu->obu.tile_list);
        if (err < 0)
            return err;

        err = mpp_av1_ref_tile_data(unit, &gbc,
                                    &obu->obu.tile_list.tile_data);
        if (err < 0)
            return err;
    } break;
    case AV1_OBU_METADATA: {
        ctx->frame_tag_size += obu->obu_size;
        err = mpp_av1_metadata_obu(ctx, &gbc, &obu->obu.metadata);
        if (err < 0)
            return err;
    } break;
    case AV1_OBU_PADDING: {
        err = mpp_av1_padding_obu(ctx, &gbc, &obu->obu.padding);
        if (err < 0)
            return err;
    } break;
    default:
        return MPP_ERR_VALUE;
    }

    end_pos = mpp_get_bits_count(&gbc);
    mpp_assert(end_pos <= (RK_S32)(unit->data_size * 8));

    if (obu->obu_size > 0 &&
        obu->header.obu_type != AV1_OBU_TILE_GROUP &&
        obu->header.obu_type != AV1_OBU_TILE_LIST &&
        obu->header.obu_type != AV1_OBU_FRAME) {
        RK_S32 nb_bits = obu->obu_size * 8 + start_pos - end_pos;

        if (nb_bits <= 0)
            return MPP_NOK;

        err = mpp_av1_trailing_bits(ctx, &gbc, nb_bits);
        if (err < 0)
            return err;
    }

    return 0;
}